

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall llvm::cl::AddLiteralOption(cl *this,Option *O,StringRef Name)

{
  StringRef Name_00;
  CommandLineParser *this_00;
  Option *O_local;
  StringRef Name_local;
  
  this_00 = ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
            ::operator->(&GlobalParser);
  Name_00.Length = (size_t)Name.Data;
  Name_00.Data = (char *)O;
  anon_unknown.dwarf_23046::CommandLineParser::addLiteralOption(this_00,(Option *)this,Name_00);
  return;
}

Assistant:

void cl::AddLiteralOption(Option &O, StringRef Name) {
  GlobalParser->addLiteralOption(O, Name);
}